

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O1

bool __thiscall Js::ByteCodeWriter::DoProfileNewScArrayOp(ByteCodeWriter *this,OpCode op)

{
  FunctionBody *pFVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  undefined4 *puVar7;
  
  uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  pFVar1 = this->m_functionWrite;
  if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_00828700;
    *puVar7 = 0;
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase,uVar6,
                            ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if (!bVar4) {
    uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
    pFVar1 = this->m_functionWrite;
    if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) {
LAB_00828700:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeNewScArrayPhase,uVar6,
                              ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.
                               functionInfo.ptr)->functionId);
    if (((!bVar4) &&
        (((pUVar2 = (this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.
                    m_utf8SourceInfo.ptr, (pUVar2->debugModeSource).ptr == (uchar *)0x0 &&
          ((pUVar2->field_0xa8 & 0x20) == 0)) || ((pUVar2->field_0xa8 & 0x40) == 0)))) &&
       ((ushort)(op - NewScArray) < 6)) {
      bVar5 = 0x29 >> ((byte)(op - NewScArray) & 0x1f);
      goto LAB_008286ef;
    }
  }
  bVar5 = 0;
LAB_008286ef:
  return (bool)(bVar5 & 1);
}

Assistant:

bool DoProfileNewScArrayOp(OpCode op)
        {
            return
                !PHASE_OFF(NativeArrayPhase, m_functionWrite) &&
                !PHASE_OFF(NativeNewScArrayPhase, m_functionWrite) &&
                !m_functionWrite->IsInDebugMode() &&
                (op == OpCode::NewScIntArray || op == OpCode::NewScFltArray || op == OpCode::NewScArray);
        }